

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void demmt_memread2(mmt_read2 *r2,void *state)

{
  void *w;
  mmt_read2 *pmVar1;
  int local_3c;
  int i_1;
  uchar *data;
  mmt_read *r1;
  cpu_mapping *m;
  uint32_t i;
  void *state_local;
  mmt_read2 *r2_local;
  
  r1 = (mmt_read *)0x0;
  m._4_4_ = 0;
  while ((m._4_4_ < max_id + 1 &&
         (((r1 = (mmt_read *)get_cpu_mapping(m._4_4_), (cpu_mapping *)r1 == (cpu_mapping *)0x0 ||
           (r2->addr < ((cpu_mapping *)r1)->cpu_addr)) ||
          (((cpu_mapping *)r1)->cpu_addr + ((cpu_mapping *)r1)->length <= r2->addr))))) {
    m._4_4_ = m._4_4_ + 1;
  }
  if (m._4_4_ != max_id + 1) {
    if (mem2_buffer == (void *)0x0) {
      mem2_buffer = malloc(0x1000);
    }
    w = mem2_buffer;
    *(uint8_t *)mem2_buffer = (r2->msg_type).type;
    *(uint *)((long)w + 1) = m._4_4_;
    *(int *)((long)w + 5) = (int)r2->addr - (int)*(undefined8 *)((long)&r1[2].id + 3);
    *(uint8_t *)((long)w + 9) = r2->len;
    memcpy((void *)((long)w + 10),r2 + 1,(ulong)*(byte *)((long)w + 9));
    demmt_memread((mmt_read *)w,state);
  }
  if (dump_memory_reads != 0) {
    pmVar1 = r2 + 1;
    if (r2->len == '\x01') {
      fprintf(_stdout,"@r 0x%lx, 0x%02x\n",r2->addr,(ulong)(pmVar1->msg_type).type);
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
    }
    else if (r2->len == '\x02') {
      fprintf(_stdout,"@r 0x%lx, 0x%04x\n",r2->addr,(ulong)*(ushort *)pmVar1);
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
    }
    else {
      if (((r2->len != '\x04') && (r2->len != '\b')) && ((r2->len != '\x10' && (r2->len != ' ')))) {
        fprintf(_stdout,"ERROR: unhandled size: %d\n",(ulong)r2->len);
        if (mmt_sync_fd != -1) {
          fflush(_stdout);
        }
        demmt_abort();
      }
      fprintf(_stdout,"@r 0x%lx, ",r2->addr);
      for (local_3c = 0; local_3c < (int)(uint)r2->len; local_3c = local_3c + 4) {
        fprintf(_stdout,"0x%08x ",(ulong)*(uint *)(&pmVar1->msg_type + local_3c));
      }
      fprintf(_stdout,"%s\n","");
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
    }
  }
  return;
}

Assistant:

void demmt_memread2(struct mmt_read2 *r2, void *state)
{
	uint32_t i;
	struct cpu_mapping *m = NULL;
	for (i = 0; i < max_id + 1; ++i)
	{
		m = get_cpu_mapping(i);
		if (m && r2->addr >= m->cpu_addr && r2->addr < m->cpu_addr + m->length)
			break;
	}

	if (i != max_id + 1)
	{
		if (!mem2_buffer)
			mem2_buffer = malloc(4096);
		struct mmt_read *r1 = mem2_buffer;
		r1->msg_type = r2->msg_type;
		r1->id = i;
		r1->offset = r2->addr - m->cpu_addr;
		r1->len = r2->len;
		memcpy(r1->data, r2->data, r1->len);
		demmt_memread(r1, state);
	}

	if (dump_memory_reads)
	{
		unsigned char *data = &r2->data[0];
		if (r2->len == 1)
			mmt_printf("@r 0x%" PRIx64 ", 0x%02x\n", r2->addr, data[0]);
		else if (r2->len == 2)
			mmt_printf("@r 0x%" PRIx64 ", 0x%04x\n", r2->addr, *(uint16_t *)&data[0]);
		else if (r2->len == 4 || r2->len == 8 || r2->len == 16 || r2->len == 32)
		{
			mmt_printf("@r 0x%" PRIx64 ", ", r2->addr);
			int i;
			for (i = 0; i < r2->len; i += 4)
				mmt_printf("0x%08x ", *(uint32_t *)&data[i]);
			mmt_printf("%s\n", "");
		}
		else
		{
			mmt_error("unhandled size: %d\n", r2->len);
			demmt_abort();
		}
	}
}